

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O2

int webSocket_send(int fd,uchar *data,uint dataLen,_Bool mod,Websocket_CommunicationType type)

{
  uint uVar1;
  uchar *package;
  ssize_t sVar2;
  
  package = (uchar *)calloc(1,(ulong)(dataLen + 0x1000));
  uVar1 = webSocket_enPackage(data,dataLen,package,dataLen + 0x1000,mod,type);
  printf("webSocket_send : %d\r\n",(ulong)uVar1);
  sVar2 = send(fd,package,(ulong)uVar1,0x4000);
  free(package);
  return (int)sVar2;
}

Assistant:

int webSocket_send(int fd, unsigned char *data, unsigned int dataLen, bool mod, Websocket_CommunicationType type) {
    unsigned char *webSocketPackage;
    unsigned int retLen, ret;
    unsigned int i;

    //printf("webSocket_send : %d\r\n", dataLen);
    //---------- websocket数据打包 ----------
    webSocketPackage = (unsigned char *)calloc(1, sizeof(char)*(dataLen + 4096));
    memset(webSocketPackage, 0, (dataLen + 128));
    retLen = (unsigned int)webSocket_enPackage(data, dataLen, webSocketPackage, (dataLen + 4096), mod, type);
    printf("webSocket_send : %d\r\n" , retLen);
//    for(i = 0; i < retLen; i ++)  printf("%.2X ", webSocketPackage[i]);
//    printf("\r\n");
    ret = (unsigned int)send(fd, webSocketPackage, retLen, MSG_NOSIGNAL);
    free(webSocketPackage);
    return ret;
}